

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O0

int notabmode(int f,int n)

{
  int iVar1;
  int n_local;
  int f_local;
  
  iVar1 = changemode(f,n,"notab");
  if (iVar1 == 0) {
    n_local = 0;
  }
  else {
    if ((f & 7U) == 0) {
      curbp->b_flag = curbp->b_flag ^ 4;
    }
    else if (n < 1) {
      curbp->b_flag = curbp->b_flag & 0xfb;
    }
    else {
      curbp->b_flag = curbp->b_flag | 4;
    }
    n_local = 1;
  }
  return n_local;
}

Assistant:

int
notabmode(int f, int n)
{
	if (changemode(f, n, "notab") == FALSE)
		return (FALSE);
	if (f & FFARG) {
		if (n <= 0)
			curbp->b_flag &= ~BFNOTAB;
		else
			curbp->b_flag |= BFNOTAB;
	} else
		curbp->b_flag ^= BFNOTAB;
	return (TRUE);
}